

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O3

void __thiscall spvtools::opt::IRContext::KillNamesAndDecorates(IRContext *this,uint32_t id)

{
  _Rb_tree_header *p_Var1;
  Module *pMVar2;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
  *this_00;
  Instruction **ppIVar3;
  iterator iVar4;
  uint32_t uVar5;
  pointer __p;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_> _Var6;
  Instruction *pIVar7;
  Instruction *debug_inst;
  Instruction *this_01;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
  pVar8;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> name_to_kill;
  pair<const_unsigned_int,_spvtools::opt::Instruction_*> name;
  uint32_t local_8c;
  Instruction **local_88;
  iterator iStack_80;
  Instruction **local_78;
  pair<const_unsigned_int,_spvtools::opt::Instruction_*> local_68;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  if ((this->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
    BuildDecorationManager(this);
  }
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<bool_(const_spvtools::opt::Instruction_&),_spvtools::opt::analysis::DecorationManager::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/decoration_manager.h:58:24)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(const_spvtools::opt::Instruction_&),_spvtools::opt::analysis::DecorationManager::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/decoration_manager.h:58:24)>
             ::_M_manager;
  analysis::DecorationManager::RemoveDecorationsFrom
            ((this->decoration_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
             _M_head_impl,id,(function<bool_(const_spvtools::opt::Instruction_&)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  local_88 = (Instruction **)0x0;
  iStack_80._M_current = (Instruction **)0x0;
  local_78 = (Instruction **)0x0;
  local_8c = id;
  if ((this->valid_analyses_ & kAnalysisNameMap) == kAnalysisNone) {
    __p = (pointer)operator_new(0x30);
    p_Var1 = &(__p->_M_t)._M_impl.super__Rb_tree_header;
    (__p->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (__p->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    *(undefined8 *)&(__p->_M_t)._M_impl = 0;
    *(undefined8 *)&(__p->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    (__p->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (__p->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (__p->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    std::
    __uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
    ::reset((__uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
             *)&this->id_to_name_,__p);
    pMVar2 = (this->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    this_01 = *(Instruction **)
               ((long)&(pMVar2->debugs2_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
    pIVar7 = (Instruction *)
             ((long)&(pMVar2->debugs2_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
    if (this_01 != pIVar7) {
      do {
        if (this_01->opcode_ - OpName < 2) {
          this_00 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
                     *)(this->id_to_name_)._M_t.
                       super___uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
                       .
                       super__Head_base<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_false>
                       ._M_head_impl;
          uVar5 = (this_01->has_result_id_ & 1) + 1;
          if (this_01->has_type_id_ == false) {
            uVar5 = (uint)this_01->has_result_id_;
          }
          uVar5 = Instruction::GetSingleWordOperand(this_01,uVar5);
          local_68.first = uVar5;
          local_68.second = this_01;
          std::
          _Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
          ::_M_insert_equal<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>
                    (this_00,&local_68);
        }
        this_01 = (this_01->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      } while (this_01 != pIVar7);
    }
    *(undefined1 *)&this->valid_analyses_ = (char)this->valid_analyses_ | kAnalysisNameMap;
  }
  pVar8 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::_Select1st<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
          ::equal_range(&((this->id_to_name_)._M_t.
                          super___uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
                          .
                          super__Head_base<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_false>
                         ._M_head_impl)->_M_t,&local_8c);
  _Var6 = pVar8.first._M_node;
  if (_Var6._M_node != pVar8.second._M_node._M_node) {
    do {
      local_68.first = _Var6._M_node[1]._M_color;
      local_68._4_4_ = *(undefined4 *)&_Var6._M_node[1].field_0x4;
      local_68.second = (Instruction *)_Var6._M_node[1]._M_parent;
      if (iStack_80._M_current == local_78) {
        std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
        _M_realloc_insert<spvtools::opt::Instruction*const&>
                  ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                    *)&local_88,iStack_80,&local_68.second);
      }
      else {
        *iStack_80._M_current = local_68.second;
        iStack_80._M_current = iStack_80._M_current + 1;
      }
      _Var6._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var6._M_node);
      iVar4._M_current = iStack_80._M_current;
      ppIVar3 = local_88;
    } while (_Var6._M_node != pVar8.second._M_node._M_node);
    for (; ppIVar3 != iVar4._M_current; ppIVar3 = ppIVar3 + 1) {
      KillInst(this,*ppIVar3);
    }
    if (local_88 != (Instruction **)0x0) {
      operator_delete(local_88,(long)local_78 - (long)local_88);
    }
  }
  return;
}

Assistant:

void IRContext::KillNamesAndDecorates(uint32_t id) {
  analysis::DecorationManager* dec_mgr = get_decoration_mgr();
  dec_mgr->RemoveDecorationsFrom(id);

  std::vector<Instruction*> name_to_kill;
  for (auto name : GetNames(id)) {
    name_to_kill.push_back(name.second);
  }
  for (Instruction* name_inst : name_to_kill) {
    KillInst(name_inst);
  }
}